

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O1

int __thiscall units::detail::unit_data::rootHertzModifier(unit_data *this,int power)

{
  unit_data uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = *this;
  uVar3 = (int)uVar1._0_1_ >> 4;
  iVar2 = 0;
  if (((uVar3 != 0 && power != 0) && (iVar2 = 0, (power & 1U) == 0)) &&
     (((uint)uVar1 >> 0x1d & (uint)uVar1 >> 0x1e & 1) != 0)) {
    iVar2 = 9;
    if (-1 < (int)(uVar3 | power)) {
      iVar2 = -9;
    }
    iVar2 = iVar2 * (power >> 1);
  }
  return iVar2;
}

Assistant:

constexpr int rootHertzModifier(int power) const
        {
            return (second_ * power == 0 || ((e_flag_ & i_flag_) == 0U) ||
                    power % 2 != 0) ?
                0 :
                (power / 2) * ((second_ < 0) || (power < 0) ? 9 : -9);
        }